

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O0

TrackData * __thiscall
BlockFloppyDisk::load
          (TrackData *__return_storage_ptr__,BlockFloppyDisk *this,CylHead *cylhead,bool param_2)

{
  pointer *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pHVar5;
  posix_error *this_01;
  int *piVar6;
  reference piVar7;
  reference this_02;
  Sector *s;
  iterator __end2;
  iterator __begin2;
  Track *__range2;
  iterator iStack_108;
  int id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  const_iterator local_e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  const_iterator local_d0;
  allocator<unsigned_char> local_c1;
  undefined1 local_c0 [8];
  Data data;
  Track track;
  char *local_80;
  void *local_78;
  uint8_t *p;
  undefined1 local_68 [4];
  int i;
  MEMORY mem;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> error_ids;
  int lba;
  bool param_2_local;
  CylHead *cylhead_local;
  BlockFloppyDisk *this_local;
  
  error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       (cylhead->cyl * (this->super_DemandDisk).super_Disk.fmt.heads + cylhead->head) *
       (this->super_DemandDisk).super_Disk.fmt.sectors;
  error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = param_2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  pHVar5 = std::unique_ptr<HDD,_std::default_delete<HDD>_>::operator->(&this->m_blockdev);
  bVar2 = HDD::Seek(pHVar5,(long)(int)error_ids.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) {
    this_01 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    posix_error::posix_error(this_01,*piVar6,"seek");
    __cxa_throw(this_01,&posix_error::typeinfo,posix_error::~posix_error);
  }
  iVar3 = Format::track_size(&(this->super_DemandDisk).super_Disk.fmt);
  MEMORY::MEMORY((MEMORY *)local_68,iVar3);
  pHVar5 = std::unique_ptr<HDD,_std::default_delete<HDD>_>::operator->(&this->m_blockdev);
  iVar3 = HDD::Read(pHVar5,(void *)mem._8_8_,(this->super_DemandDisk).super_Disk.fmt.sectors,false);
  if (iVar3 < (this->super_DemandDisk).super_Disk.fmt.sectors) {
    for (p._4_4_ = 0; uVar1 = mem._8_8_, iVar3 = p._4_4_,
        p._4_4_ < (this->super_DemandDisk).super_Disk.fmt.sectors; p._4_4_ = p._4_4_ + 1) {
      iVar4 = Format::sector_size(&(this->super_DemandDisk).super_Disk.fmt);
      local_78 = (void *)(uVar1 + (long)(iVar3 * iVar4));
      pHVar5 = std::unique_ptr<HDD,_std::default_delete<HDD>_>::operator->(&this->m_blockdev);
      bVar2 = HDD::Seek(pHVar5,(long)((int)error_ids.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                                     p._4_4_));
      if (bVar2) {
        pHVar5 = std::unique_ptr<HDD,_std::default_delete<HDD>_>::operator->(&this->m_blockdev);
        iVar3 = HDD::Read(pHVar5,local_78,1,false);
        if (iVar3 == 0) goto LAB_0024fbd0;
      }
      else {
LAB_0024fbd0:
        local_80 = CHR(cylhead->cyl,cylhead->head,
                       (this->super_DemandDisk).super_Disk.fmt.base + p._4_4_);
        Message<char_const*>(msgWarning,"error reading %s",&local_80);
        track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (this->super_DemandDisk).super_Disk.fmt.base + p._4_4_;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_40,
                   (value_type_conflict *)
                   ((long)&track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
  }
  Track::Track((Track *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
  Track::format((Track *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,cylhead,
                &(this->super_DemandDisk).super_Disk.fmt);
  std::allocator<unsigned_char>::allocator(&local_c1);
  Data::vector<unsigned_char*,void>
            ((Data *)local_c0,(uchar *)mem._8_8_,(uchar *)(mem._8_8_ + (long)(int)mem._vptr_MEMORY),
             &local_c1);
  std::allocator<unsigned_char>::~allocator(&local_c1);
  local_d8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_d0,&local_d8);
  local_e8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_e0,&local_e8);
  Track::populate((Track *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_d0,local_e0);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_40);
  iStack_108 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_40);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffef8), bVar2) {
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar3 = *piVar7;
    this_00 = &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2 = Track::begin((Track *)this_00);
    s = (Sector *)Track::end((Track *)this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar2) {
      this_02 = __gnu_cxx::
                __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
                operator*(&__end2);
      if ((this_02->header).sector == iVar3) {
        Sector::set_baddatacrc(this_02,true);
      }
      __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  TrackData::TrackData
            (__return_storage_ptr__,cylhead,
             (Track *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Data::~Data((Data *)local_c0);
  Track::~Track((Track *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  MEMORY::~MEMORY((MEMORY *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        auto lba = (cylhead.cyl * fmt.heads + cylhead.head) * fmt.sectors;
        std::vector<int> error_ids;

        if (!m_blockdev->Seek(lba))
            throw posix_error(errno, "seek");

        MEMORY mem(fmt.track_size());
        if (m_blockdev->Read(mem.pb, fmt.sectors) < fmt.sectors)
        {
            // Retry sectors individually
            for (auto i = 0; i < fmt.sectors; ++i)
            {
                auto p = mem.pb + i * fmt.sector_size();
                if (!m_blockdev->Seek(lba + i) || !m_blockdev->Read(p, 1))
                {
                    Message(msgWarning, "error reading %s",
                        CHR(cylhead.cyl, cylhead.head, fmt.base + i));
                    error_ids.push_back(fmt.base + i);
                }
            }
        }

        Track track;
        track.format(cylhead, fmt);

        Data data(mem.pb, mem.pb + mem.size);
        track.populate(data.begin(), data.end());

        // Flag any errors
        for (auto id : error_ids)
        {
            for (auto& s : track)
                if (s.header.sector == id)
                    s.set_baddatacrc();
        }

        return TrackData(cylhead, std::move(track));
    }